

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::bindingsParameters(Kvm *this,Value *bindings)

{
  pointer *ppppVVar1;
  _func_int **pp_Var2;
  Value *pVVar3;
  Value *pVVar4;
  Value *result;
  Value *local_38;
  
  pVVar4 = this->NIL;
  if (pVVar4 != bindings) {
    local_38 = (Value *)0x0;
    Kgc::pushLocalStackRoot(&this->gc_,&local_38);
    pVVar3 = bindingsParameters(this,*(Value **)&bindings[1].type_);
    pp_Var2 = (_func_int **)bindings[1]._vptr_Value[3];
    local_38 = pVVar3;
    pVVar4 = Kgc::allocValue(&this->gc_,CELL);
    pVVar4[1]._vptr_Value = pp_Var2;
    *(Value **)&pVVar4[1].type_ = pVVar3;
    ppppVVar1 = &(this->gc_).localStackRoots_.
                 super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    *ppppVVar1 = *ppppVVar1 + -1;
  }
  return pVVar4;
}

Assistant:

const Value* Kvm::bindingsParameters(const Value *bindings)
{
    if (bindings == NIL) return NIL;

    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = bindingsParameters(cdr(bindings));
    result = makeCell(bindingParameter(car(bindings)), result);
    return result;
}